

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void __thiscall SQSharedState::~SQSharedState(SQSharedState *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *this_00;
  SQObjectPtr *this_01;
  SQObjectPtr *this_02;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  size_type sVar4;
  SQTable *pSVar5;
  SQObjectPtr *pSVar6;
  SQObjectPtrVec *pSVar7;
  SQCollectable_conflict *pSVar8;
  uint uVar9;
  SQCollectable_conflict *pSVar10;
  
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  pSVar5 = (this->_constructorstr).super_SQObject._unVal.pTable;
  SVar3 = (this->_constructorstr).super_SQObject._type;
  (this->_constructorstr).super_SQObject._type = 0;
  (this->_constructorstr).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_constructorstr).super_SQObject.field_0x5 = 0;
  (this->_constructorstr).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_constructorstr).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  (*(((this->_registry).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_consts).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_metamethodsmap).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  this_00 = &this->_registry;
  pSVar5 = (this->_registry).super_SQObject._unVal.pTable;
  SVar3 = (this->_registry).super_SQObject._type;
  (this_00->super_SQObject)._type = 0;
  (this_00->super_SQObject)._flags = '\0';
  *(undefined3 *)&(this_00->super_SQObject).field_0x5 = 0;
  (this->_registry).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_registry).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this_01 = &this->_consts;
  pSVar5 = (this->_consts).super_SQObject._unVal.pTable;
  SVar3 = (this->_consts).super_SQObject._type;
  (this_01->super_SQObject)._type = 0;
  (this_01->super_SQObject)._flags = '\0';
  *(undefined3 *)&(this_01->super_SQObject).field_0x5 = 0;
  (this->_consts).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_consts).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this_02 = &this->_metamethodsmap;
  pSVar5 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  SVar3 = (this->_metamethodsmap).super_SQObject._type;
  (this_02->super_SQObject)._type = 0;
  (this_02->super_SQObject)._flags = '\0';
  *(undefined3 *)&(this_02->super_SQObject).field_0x5 = 0;
  (this->_metamethodsmap).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_metamethodsmap).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  while( true ) {
    sVar4 = this->_systemstrings->_size;
    if (sVar4 == 0) break;
    pSVar6 = this->_systemstrings->_vals;
    uVar9 = sVar4 - 1;
    pSVar5 = pSVar6[uVar9].super_SQObject._unVal.pTable;
    SVar3 = pSVar6[uVar9].super_SQObject._type;
    pSVar2 = pSVar6 + uVar9;
    (pSVar2->super_SQObject)._type = 0;
    (pSVar2->super_SQObject)._flags = '\0';
    *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = 0;
    (pSVar2->super_SQObject)._unVal.pTable = (SQTable *)0x0;
    pSVar6[uVar9].super_SQObject._type = OT_NULL;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pSVar7 = this->_systemstrings;
    uVar9 = pSVar7->_size - 1;
    pSVar7->_size = uVar9;
    SQObjectPtr::~SQObjectPtr(pSVar7->_vals + uVar9);
  }
  (*(((this->_root_vm).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  pSVar2 = &this->_root_vm;
  pSVar5 = (this->_root_vm).super_SQObject._unVal.pTable;
  SVar3 = (this->_root_vm).super_SQObject._type;
  (pSVar2->super_SQObject)._type = 0;
  (pSVar2->super_SQObject)._flags = '\0';
  *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = 0;
  (this->_root_vm).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_root_vm).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_table_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_table_default_delegate).super_SQObject._type;
  (this->_table_default_delegate).super_SQObject._type = 0;
  (this->_table_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_table_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_table_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_table_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_array_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_array_default_delegate).super_SQObject._type;
  (this->_array_default_delegate).super_SQObject._type = 0;
  (this->_array_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_array_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_array_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_array_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_string_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_string_default_delegate).super_SQObject._type;
  (this->_string_default_delegate).super_SQObject._type = 0;
  (this->_string_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_string_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_string_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_string_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_number_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_number_default_delegate).super_SQObject._type;
  (this->_number_default_delegate).super_SQObject._type = 0;
  (this->_number_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_number_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_number_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_number_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_closure_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_closure_default_delegate).super_SQObject._type;
  (this->_closure_default_delegate).super_SQObject._type = 0;
  (this->_closure_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_closure_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_closure_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_closure_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_generator_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_generator_default_delegate).super_SQObject._type;
  (this->_generator_default_delegate).super_SQObject._type = 0;
  (this->_generator_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_generator_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_generator_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_generator_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_thread_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_thread_default_delegate).super_SQObject._type;
  (this->_thread_default_delegate).super_SQObject._type = 0;
  (this->_thread_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_thread_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_thread_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_thread_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_class_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_class_default_delegate).super_SQObject._type;
  (this->_class_default_delegate).super_SQObject._type = 0;
  (this->_class_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_class_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_class_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_class_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_instance_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_instance_default_delegate).super_SQObject._type;
  (this->_instance_default_delegate).super_SQObject._type = 0;
  (this->_instance_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_instance_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_instance_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_instance_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_weakref_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_weakref_default_delegate).super_SQObject._type;
  (this->_weakref_default_delegate).super_SQObject._type = 0;
  (this->_weakref_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_weakref_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_weakref_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_weakref_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar5 = (this->_userdata_default_delegate).super_SQObject._unVal.pTable;
  SVar3 = (this->_userdata_default_delegate).super_SQObject._type;
  (this->_userdata_default_delegate).super_SQObject._type = 0;
  (this->_userdata_default_delegate).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_userdata_default_delegate).super_SQObject.field_0x5 = 0;
  (this->_userdata_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_userdata_default_delegate).super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  RefTable::Finalize(&this->_refs_table);
  pSVar10 = this->_gc_chain;
  if (pSVar10 != (SQCollectable_conflict *)0x0) {
    pSVar1 = &(pSVar10->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    do {
      (*(pSVar10->super_SQRefCounted)._vptr_SQRefCounted[5])(pSVar10);
      pSVar8 = pSVar10->_gc_next;
      if (pSVar8 != (SQCollectable_conflict *)0x0) {
        pSVar1 = &(pSVar8->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pSVar1 = &(pSVar10->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar10->super_SQRefCounted)._vptr_SQRefCounted[2])(pSVar10);
      }
      pSVar10 = pSVar8;
    } while (pSVar8 != (SQCollectable_conflict *)0x0);
  }
  while (pSVar10 = this->_gc_chain, pSVar10 != (SQCollectable_conflict *)0x0) {
    pSVar1 = &(pSVar10->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    (*(pSVar10->super_SQRefCounted)._vptr_SQRefCounted[2])();
  }
  sqvector<SQObjectPtr,_unsigned_int>::_releasedata(this->_types);
  sq_vm_free(this->_alloc_ctx,this->_types,0x18);
  sqvector<SQObjectPtr,_unsigned_int>::_releasedata(this->_systemstrings);
  sq_vm_free(this->_alloc_ctx,this->_systemstrings,0x18);
  sqvector<SQObjectPtr,_unsigned_int>::_releasedata(this->_metamethodnames);
  sq_vm_free(this->_alloc_ctx,this->_metamethodnames,0x18);
  SQStringTable::~SQStringTable(this->_stringtable);
  sq_vm_free(this->_alloc_ctx,this->_stringtable,0x20);
  if (this->_scratchpad != (SQChar *)0x0) {
    sq_vm_free(this->_alloc_ctx,this->_scratchpad,this->_scratchpadsize);
  }
  SQObjectPtr::~SQObjectPtr(&this->_userdata_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_weakref_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_instance_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_class_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_thread_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_closure_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_generator_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_number_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_string_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_array_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_table_default_delegate);
  SQObjectPtr::~SQObjectPtr(pSVar2);
  SQObjectPtr::~SQObjectPtr(&this->_constructorstr);
  SQObjectPtr::~SQObjectPtr(this_01);
  SQObjectPtr::~SQObjectPtr(this_00);
  RefTable::~RefTable(&this->_refs_table);
  SQObjectPtr::~SQObjectPtr(this_02);
  return;
}

Assistant:

SQSharedState::~SQSharedState()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    _constructorstr.Null();
    _table(_registry)->Finalize();
    _table(_consts)->Finalize();
    _table(_metamethodsmap)->Finalize();
    _registry.Null();
    _consts.Null();
    _metamethodsmap.Null();
    while(!_systemstrings->empty()) {
        _systemstrings->back().Null();
        _systemstrings->pop_back();
    }
    _thread(_root_vm)->Finalize();
    _root_vm.Null();
    _table_default_delegate.Null();
    _array_default_delegate.Null();
    _string_default_delegate.Null();
    _number_default_delegate.Null();
    _closure_default_delegate.Null();
    _generator_default_delegate.Null();
    _thread_default_delegate.Null();
    _class_default_delegate.Null();
    _instance_default_delegate.Null();
    _weakref_default_delegate.Null();
    _userdata_default_delegate.Null();
    _refs_table.Finalize();
#ifndef NO_GARBAGE_COLLECTOR
    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_gc_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
        }
    }
    assert(_gc_chain==NULL); //just to proove a theory
    while(_gc_chain){
        _gc_chain->_uiRef++;
        _gc_chain->Release();
    }
#endif

    sq_delete(_alloc_ctx, _types, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _systemstrings, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _metamethodnames, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _stringtable,SQStringTable);
    if(_scratchpad)SQ_FREE(_alloc_ctx,_scratchpad,_scratchpadsize);
}